

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example9.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  Box *this;
  LightSource *l;
  BmpImage *this_00;
  ColorMap *this_01;
  Scene *this_02;
  PlaneMap *this_03;
  Vector local_a8;
  Vector local_88;
  Vector local_68;
  Vector local_48;
  
  this = (Box *)operator_new(400);
  local_88.x = 0.0;
  local_88.y = -2.0;
  local_88.z = 5.0;
  local_a8.x = 8.0;
  local_a8.y = 0.0;
  local_a8.z = 3.0;
  local_68.x = -8.0;
  local_68.y = 0.0;
  local_68.z = 3.0;
  local_48.x._0_4_ = 0;
  local_48.x._4_4_ = 0;
  local_48.y._0_4_ = 0;
  local_48.y._4_4_ = 0xc0080000;
  local_48.z = 0.0;
  Box::Box(this,&local_88,&local_a8,&local_68,&local_48);
  l = (LightSource *)operator_new(0x40);
  (l->color).x = 1.0;
  (l->color).y = 1.0;
  l->_vptr_LightSource = (_func_int **)&PTR__LightSource_0010ac20;
  (l->color).z = 1.0;
  l[1]._vptr_LightSource = (_func_int **)0x401c000000000000;
  l[1].color.x = 10.0;
  l[1].color.y = -10.0;
  l[1].color.z = 20.0;
  this_00 = (BmpImage *)operator_new(0x20);
  BmpImage::BmpImage(this_00,"backgnd.bmp");
  this_01 = (ColorMap *)operator_new(0x68);
  ColorMap::ColorMap(this_01,(Image *)this_00);
  (this_01->super_Texture).scale.z = 25.0;
  (this_01->super_Texture).scale.x = 25.0;
  (this_01->super_Texture).scale.y = 25.0;
  this_02 = (Scene *)operator_new(0xe8);
  Scene::Scene(this_02);
  this_03 = (PlaneMap *)operator_new(0x38);
  local_88.x = 0.0;
  local_88.y = -1.0;
  local_88.z = -1.0;
  local_a8.x = 1.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  PlaneMap::PlaneMap(this_03,&local_88,&local_a8);
  (this->super_GeometricObject).mapping = (Map *)this_03;
  GeometricObject::add((GeometricObject *)this,(Texture *)this_01);
  (this->super_GeometricObject).def_material.ka = 0.3;
  (this->super_GeometricObject).def_material.kd = 0.8;
  (this->super_GeometricObject).def_material.ks = 0.3;
  (this->super_GeometricObject).def_material.kr = 0.0;
  (this->super_GeometricObject).def_material.p = 5;
  dVar1 = Grayzer::Medium::glass.beta;
  (this->super_GeometricObject).def_material.med.ior = Grayzer::Medium::glass.ior;
  (this->super_GeometricObject).def_material.med.beta = dVar1;
  (this->super_GeometricObject).def_material.color.x = 1.0;
  (this->super_GeometricObject).def_material.color.y = 1.0;
  (this->super_GeometricObject).def_material.color.z = 1.0;
  Scene::add(this_02,(GeometricObject *)this);
  Scene::add(this_02,l);
  (this_02->background).x = 0.196078;
  (this_02->background).y = 0.6;
  local_88.z = 0.0;
  (this_02->background).z = 0.8;
  local_88.x = 0.0;
  local_88.y = 0.0;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 1.0;
  local_68.x = 0.0;
  local_68.y = 1.0;
  local_68.z = 0.0;
  Scene::setCamera(this_02,&local_88,&local_a8,&local_68);
  render_scene(this_02,1.6,1.0,0x140,200,"SAMPLE90.TGA");
  return 0;
}

Assistant:

int main()
{
    Box *b = new Box(Vector(0,-2,5),Vector(8,0,3),Vector(-8,0,3),Vector(0,-3,0));
//  Sphere *s = new Sphere(Vector(0,0,5),50);
    LightSource *Light1 = new PointLight(Vector(7,10,-10),20);
    BmpImage *img = new BmpImage("backgnd.bmp");
    ColorMap *cmap = new ColorMap(img);

    cmap->scale = 25;

    Scene* scene = new Scene;

    b->mapping = new PlaneMap(Vector(0,-1,-1),Vector(1,0,0));
    b->add(cmap);
    b->ambient(0.3);
    b->diffuse(0.8);
    b->specular(0.3);
    b->reflection(0.0);
    b->ior(0.0);
    b->phong_size(5);
    b->medium(Grayzer::Medium::glass);
    b->color(1);

    scene->add(b);
    scene->add(Light1);

    scene->setBackground(SkyBlue);
    scene->setCamera(Vector(0),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.6,1.0,320,200,"SAMPLE90.TGA");
}